

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void aom_smooth_v_predictor_16x64_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  byte bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ushort uVar9;
  long in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  ushort uVar10;
  ushort uVar17;
  ushort uVar21;
  ushort uVar25;
  ushort uVar29;
  ushort uVar33;
  ushort uVar37;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  undefined1 auVar16 [16];
  int y_mask;
  __m128i scaled_bottom_left_hi;
  __m128i scaled_bottom_left_lo;
  __m128i inverted_weights_hi;
  __m128i inverted_weights_lo;
  __m128i weights_hi;
  __m128i weights_lo;
  __m128i weights;
  int left_offset;
  uint8_t *weights_base_ptr;
  __m128i top_hi;
  __m128i top_lo;
  __m128i top;
  __m128i zero;
  __m128i round;
  __m128i scale;
  __m128i bottom_left;
  __m128i pred2_1;
  __m128i pred1_1;
  __m128i pred_sum2_1;
  __m128i pred_sum1_1;
  __m128i weighted_px2_1;
  __m128i weighted_px1_1;
  __m128i pred2;
  __m128i pred1;
  __m128i pred_sum2;
  __m128i pred_sum1;
  __m128i weighted_px2;
  __m128i weighted_px1;
  int local_87c;
  int local_83c;
  int local_7c4;
  undefined8 *local_730;
  byte bStack_670;
  byte bStack_66f;
  byte bStack_66e;
  byte bStack_66d;
  byte bStack_66c;
  byte bStack_66b;
  byte bStack_66a;
  byte bStack_669;
  byte bStack_650;
  byte bStack_64f;
  byte bStack_64e;
  byte bStack_64d;
  byte bStack_64c;
  byte bStack_64b;
  byte bStack_64a;
  byte bStack_649;
  byte local_618;
  byte bStack_617;
  byte bStack_616;
  byte bStack_615;
  byte bStack_614;
  byte bStack_613;
  byte bStack_612;
  byte bStack_611;
  byte local_5d8;
  byte bStack_5d7;
  byte bStack_5d6;
  byte bStack_5d5;
  byte bStack_5d4;
  byte bStack_5d3;
  byte bStack_5d2;
  byte bStack_5d1;
  ushort uStack_5c6;
  ushort uStack_5c4;
  ushort uStack_5c2;
  ushort uStack_5be;
  ushort uStack_5bc;
  ushort uStack_5ba;
  ushort uStack_5a6;
  ushort uStack_5a4;
  ushort uStack_5a2;
  ushort uStack_59e;
  ushort uStack_59c;
  ushort uStack_59a;
  ushort uStack_582;
  ushort uStack_57a;
  ushort uStack_566;
  ushort uStack_564;
  ushort uStack_562;
  ushort uStack_55e;
  ushort uStack_55c;
  ushort uStack_55a;
  short local_3b8;
  short sStack_3b6;
  short sStack_3b4;
  short sStack_3b2;
  short sStack_3b0;
  short sStack_3ae;
  short sStack_3ac;
  short sStack_3aa;
  ushort uStack_396;
  ushort uStack_394;
  ushort uStack_392;
  ushort uStack_38e;
  ushort uStack_38c;
  ushort uStack_38a;
  short local_388;
  short sStack_386;
  short sStack_384;
  short sStack_382;
  short sStack_380;
  short sStack_37e;
  short sStack_37c;
  short sStack_37a;
  ushort uStack_376;
  ushort uStack_374;
  ushort uStack_372;
  ushort uStack_36e;
  ushort uStack_36c;
  ushort uStack_36a;
  short local_1f8;
  short sStack_1f6;
  short sStack_1f4;
  short sStack_1f2;
  short sStack_1f0;
  short sStack_1ee;
  short sStack_1ec;
  short sStack_1ea;
  ushort uStack_1d6;
  ushort uStack_1d4;
  ushort uStack_1d2;
  ushort uStack_1ce;
  ushort uStack_1cc;
  ushort uStack_1ca;
  short local_1c8;
  short sStack_1c6;
  short sStack_1c4;
  short sStack_1c2;
  short sStack_1c0;
  short sStack_1be;
  short sStack_1bc;
  short sStack_1ba;
  ushort uStack_1b6;
  ushort uStack_1b4;
  ushort uStack_1b2;
  ushort uStack_1ae;
  ushort uStack_1ac;
  ushort uStack_1aa;
  __m128i scaled_bottom_left_y_1;
  __m128i weights_y_1;
  __m128i y_select_1;
  int y_mask_1;
  __m128i scaled_bottom_left_y;
  __m128i weights_y;
  __m128i y_select;
  
  bVar1 = *(byte *)(in_RCX + 0x3f);
  uVar9 = (ushort)bVar1;
  uVar2 = *in_RDX;
  uVar3 = in_RDX[1];
  local_5d8 = (byte)uVar2;
  bStack_5d7 = (byte)((ulong)uVar2 >> 8);
  bStack_5d6 = (byte)((ulong)uVar2 >> 0x10);
  bStack_5d5 = (byte)((ulong)uVar2 >> 0x18);
  bStack_5d4 = (byte)((ulong)uVar2 >> 0x20);
  bStack_5d3 = (byte)((ulong)uVar2 >> 0x28);
  bStack_5d2 = (byte)((ulong)uVar2 >> 0x30);
  bStack_5d1 = (byte)((ulong)uVar2 >> 0x38);
  bStack_650 = (byte)uVar3;
  bStack_64f = (byte)((ulong)uVar3 >> 8);
  bStack_64e = (byte)((ulong)uVar3 >> 0x10);
  bStack_64d = (byte)((ulong)uVar3 >> 0x18);
  bStack_64c = (byte)((ulong)uVar3 >> 0x20);
  bStack_64b = (byte)((ulong)uVar3 >> 0x28);
  bStack_64a = (byte)((ulong)uVar3 >> 0x30);
  bStack_649 = (byte)((ulong)uVar3 >> 0x38);
  local_730 = in_RDI;
  for (local_7c4 = 0; local_7c4 < 0x40; local_7c4 = local_7c4 + 0x10) {
    uVar2 = *(undefined8 *)(smooth_weights + (long)local_7c4 + 0x3c);
    uVar3 = *(undefined8 *)(smooth_weights + (long)local_7c4 + 0x44);
    local_618 = (byte)uVar2;
    bStack_617 = (byte)((ulong)uVar2 >> 8);
    bStack_616 = (byte)((ulong)uVar2 >> 0x10);
    bStack_615 = (byte)((ulong)uVar2 >> 0x18);
    bStack_614 = (byte)((ulong)uVar2 >> 0x20);
    bStack_613 = (byte)((ulong)uVar2 >> 0x28);
    bStack_612 = (byte)((ulong)uVar2 >> 0x30);
    bStack_611 = (byte)((ulong)uVar2 >> 0x38);
    bStack_670 = (byte)uVar3;
    bStack_66f = (byte)((ulong)uVar3 >> 8);
    bStack_66e = (byte)((ulong)uVar3 >> 0x10);
    bStack_66d = (byte)((ulong)uVar3 >> 0x18);
    bStack_66c = (byte)((ulong)uVar3 >> 0x20);
    bStack_66b = (byte)((ulong)uVar3 >> 0x28);
    bStack_66a = (byte)((ulong)uVar3 >> 0x30);
    bStack_669 = (byte)((ulong)uVar3 >> 0x38);
    uStack_5a6 = (ushort)bStack_617;
    uStack_5a4 = (ushort)bStack_616;
    uStack_5a2 = (ushort)bStack_615;
    uStack_59e = (ushort)bStack_613;
    uStack_59c = (ushort)bStack_612;
    uStack_59a = (ushort)bStack_611;
    uStack_5c6 = (ushort)bStack_66f;
    uStack_5c4 = (ushort)bStack_66e;
    uStack_5c2 = (ushort)bStack_66d;
    uStack_5be = (ushort)bStack_66b;
    uStack_5bc = (ushort)bStack_66a;
    uStack_5ba = (ushort)bStack_669;
    uStack_566 = (ushort)bVar1;
    uStack_564 = (ushort)bVar1;
    uStack_562 = (ushort)bVar1;
    uStack_55e = (ushort)bVar1;
    uStack_55c = (ushort)bVar1;
    uStack_55a = (ushort)bVar1;
    uStack_582 = (ushort)bVar1;
    uStack_57a = (ushort)bVar1;
    for (local_83c = 0x1000100; local_83c < 0xf0e0f0f; local_83c = local_83c + 0x2020202) {
      auVar8[1] = 0;
      auVar8[0] = local_618;
      auVar8[2] = bStack_617;
      auVar8[3] = 0;
      auVar8[4] = bStack_616;
      auVar8[5] = 0;
      auVar8[6] = bStack_615;
      auVar8[7] = 0;
      auVar8[9] = 0;
      auVar8[8] = bStack_614;
      auVar8[10] = bStack_613;
      auVar8[0xb] = 0;
      auVar8[0xc] = bStack_612;
      auVar8[0xd] = 0;
      auVar8[0xe] = bStack_611;
      auVar8[0xf] = 0;
      auVar7._8_8_ = CONCAT44(local_83c,local_83c);
      auVar7._0_8_ = CONCAT44(local_83c,local_83c);
      auVar14 = pshufb(auVar8,auVar7);
      auVar6._2_2_ = (0x100 - uStack_5a6) * uStack_566;
      auVar6._0_2_ = (0x100 - (ushort)local_618) * uVar9;
      auVar6._4_2_ = (0x100 - uStack_5a4) * uStack_564;
      auVar6._6_2_ = (0x100 - uStack_5a2) * uStack_562;
      auVar6._10_2_ = (0x100 - uStack_59e) * uStack_55e;
      auVar6._8_2_ = (0x100 - (ushort)bStack_614) * uVar9;
      auVar6._12_2_ = (0x100 - uStack_59c) * uStack_55c;
      auVar6._14_2_ = (0x100 - uStack_59a) * uStack_55a;
      auVar5._8_8_ = CONCAT44(local_83c,local_83c);
      auVar5._0_8_ = CONCAT44(local_83c,local_83c);
      auVar15 = pshufb(auVar6,auVar5);
      uStack_1b6 = (ushort)bStack_5d7;
      uStack_1b4 = (ushort)bStack_5d6;
      uStack_1b2 = (ushort)bStack_5d5;
      uStack_1ae = (ushort)bStack_5d3;
      uStack_1ac = (ushort)bStack_5d2;
      uStack_1aa = (ushort)bStack_5d1;
      local_1c8 = auVar14._0_2_;
      sStack_1c6 = auVar14._2_2_;
      sStack_1c4 = auVar14._4_2_;
      sStack_1c2 = auVar14._6_2_;
      sStack_1c0 = auVar14._8_2_;
      sStack_1be = auVar14._10_2_;
      sStack_1bc = auVar14._12_2_;
      sStack_1ba = auVar14._14_2_;
      uStack_1d6 = (ushort)bStack_64f;
      uStack_1d4 = (ushort)bStack_64e;
      uStack_1d2 = (ushort)bStack_64d;
      uStack_1ce = (ushort)bStack_64b;
      uStack_1cc = (ushort)bStack_64a;
      uStack_1ca = (ushort)bStack_649;
      local_1f8 = auVar15._0_2_;
      sStack_1f6 = auVar15._2_2_;
      sStack_1f4 = auVar15._4_2_;
      sStack_1f2 = auVar15._6_2_;
      sStack_1f0 = auVar15._8_2_;
      sStack_1ee = auVar15._10_2_;
      sStack_1ec = auVar15._12_2_;
      sStack_1ea = auVar15._14_2_;
      uVar10 = local_1f8 + (ushort)local_5d8 * local_1c8 + 0x80;
      uVar17 = sStack_1f6 + uStack_1b6 * sStack_1c6 + 0x80;
      uVar21 = sStack_1f4 + uStack_1b4 * sStack_1c4 + 0x80;
      uVar25 = sStack_1f2 + uStack_1b2 * sStack_1c2 + 0x80;
      uVar29 = sStack_1f0 + (ushort)bStack_5d4 * sStack_1c0 + 0x80;
      uVar33 = sStack_1ee + uStack_1ae * sStack_1be + 0x80;
      uVar37 = sStack_1ec + uStack_1ac * sStack_1bc + 0x80;
      uVar41 = sStack_1ea + uStack_1aa * sStack_1ba + 0x80;
      uVar11 = uVar10 >> 8;
      uVar18 = uVar17 >> 8;
      uVar22 = uVar21 >> 8;
      uVar26 = uVar25 >> 8;
      uVar30 = uVar29 >> 8;
      uVar34 = uVar33 >> 8;
      uVar38 = uVar37 >> 8;
      uVar42 = uVar41 >> 8;
      uVar12 = local_1f8 + (ushort)bStack_650 * local_1c8 + 0x80;
      uVar19 = sStack_1f6 + uStack_1d6 * sStack_1c6 + 0x80;
      uVar23 = sStack_1f4 + uStack_1d4 * sStack_1c4 + 0x80;
      uVar27 = sStack_1f2 + uStack_1d2 * sStack_1c2 + 0x80;
      uVar31 = sStack_1f0 + (ushort)bStack_64c * sStack_1c0 + 0x80;
      uVar35 = sStack_1ee + uStack_1ce * sStack_1be + 0x80;
      uVar39 = sStack_1ec + uStack_1cc * sStack_1bc + 0x80;
      uVar43 = sStack_1ea + uStack_1ca * sStack_1ba + 0x80;
      uVar13 = uVar12 >> 8;
      uVar20 = uVar19 >> 8;
      uVar24 = uVar23 >> 8;
      uVar28 = uVar27 >> 8;
      uVar32 = uVar31 >> 8;
      uVar36 = uVar35 >> 8;
      uVar40 = uVar39 >> 8;
      uVar44 = uVar43 >> 8;
      *local_730 = CONCAT17((uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8) - (0xff < uVar42)
                            ,CONCAT16((uVar38 != 0) * (uVar38 < 0x100) * (char)(uVar37 >> 8) -
                                      (0xff < uVar38),
                                      CONCAT15((uVar34 != 0) * (uVar34 < 0x100) *
                                               (char)(uVar33 >> 8) - (0xff < uVar34),
                                               CONCAT14((uVar30 != 0) * (uVar30 < 0x100) *
                                                        (char)(uVar29 >> 8) - (0xff < uVar30),
                                                        CONCAT13((uVar26 != 0) * (uVar26 < 0x100) *
                                                                 (char)(uVar25 >> 8) -
                                                                 (0xff < uVar26),
                                                                 CONCAT12((uVar22 != 0) *
                                                                          (uVar22 < 0x100) *
                                                                          (char)(uVar21 >> 8) -
                                                                          (0xff < uVar22),
                                                                          CONCAT11((uVar18 != 0) *
                                                                                   (uVar18 < 0x100)
                                                                                   * (char)(uVar17 
                                                  >> 8) - (0xff < uVar18),
                                                  (uVar11 != 0) * (uVar11 < 0x100) *
                                                  (char)(uVar10 >> 8) - (0xff < uVar11))))))));
      local_730[1] = CONCAT17((uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8) -
                              (0xff < uVar44),
                              CONCAT16((uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8) -
                                       (0xff < uVar40),
                                       CONCAT15((uVar36 != 0) * (uVar36 < 0x100) *
                                                (char)(uVar35 >> 8) - (0xff < uVar36),
                                                CONCAT14((uVar32 != 0) * (uVar32 < 0x100) *
                                                         (char)(uVar31 >> 8) - (0xff < uVar32),
                                                         CONCAT13((uVar28 != 0) * (uVar28 < 0x100) *
                                                                  (char)(uVar27 >> 8) -
                                                                  (0xff < uVar28),
                                                                  CONCAT12((uVar24 != 0) *
                                                                           (uVar24 < 0x100) *
                                                                           (char)(uVar23 >> 8) -
                                                                           (0xff < uVar24),
                                                                           CONCAT11((uVar20 != 0) *
                                                                                    (uVar20 < 0x100)
                                                                                    * (char)(uVar19 
                                                  >> 8) - (0xff < uVar20),
                                                  (uVar13 != 0) * (uVar13 < 0x100) *
                                                  (char)(uVar12 >> 8) - (0xff < uVar13))))))));
      local_730 = (undefined8 *)(in_RSI + (long)local_730);
    }
    for (local_87c = 0x1000100; local_87c < 0xf0e0f0f; local_87c = local_87c + 0x2020202) {
      auVar4[1] = 0;
      auVar4[0] = bStack_670;
      auVar4[2] = bStack_66f;
      auVar4[3] = 0;
      auVar4[4] = bStack_66e;
      auVar4[5] = 0;
      auVar4[6] = bStack_66d;
      auVar4[7] = 0;
      auVar4[9] = 0;
      auVar4[8] = bStack_66c;
      auVar4[10] = bStack_66b;
      auVar4[0xb] = 0;
      auVar4[0xc] = bStack_66a;
      auVar4[0xd] = 0;
      auVar4[0xe] = bStack_669;
      auVar4[0xf] = 0;
      auVar16._8_8_ = CONCAT44(local_87c,local_87c);
      auVar16._0_8_ = CONCAT44(local_87c,local_87c);
      auVar16 = pshufb(auVar4,auVar16);
      auVar15._2_2_ = (0x100 - uStack_5c6) * uStack_566;
      auVar15._0_2_ = (0x100 - (ushort)bStack_670) * uVar9;
      auVar15._4_2_ = (0x100 - uStack_5c4) * uStack_564;
      auVar15._6_2_ = (0x100 - uStack_5c2) * uStack_582;
      auVar15._10_2_ = (0x100 - uStack_5be) * uStack_55e;
      auVar15._8_2_ = (0x100 - (ushort)bStack_66c) * uVar9;
      auVar15._12_2_ = (0x100 - uStack_5bc) * uStack_55c;
      auVar15._14_2_ = (0x100 - uStack_5ba) * uStack_57a;
      auVar14._8_8_ = CONCAT44(local_87c,local_87c);
      auVar14._0_8_ = CONCAT44(local_87c,local_87c);
      auVar14 = pshufb(auVar15,auVar14);
      uStack_376 = (ushort)bStack_5d7;
      uStack_374 = (ushort)bStack_5d6;
      uStack_372 = (ushort)bStack_5d5;
      uStack_36e = (ushort)bStack_5d3;
      uStack_36c = (ushort)bStack_5d2;
      uStack_36a = (ushort)bStack_5d1;
      local_388 = auVar16._0_2_;
      sStack_386 = auVar16._2_2_;
      sStack_384 = auVar16._4_2_;
      sStack_382 = auVar16._6_2_;
      sStack_380 = auVar16._8_2_;
      sStack_37e = auVar16._10_2_;
      sStack_37c = auVar16._12_2_;
      sStack_37a = auVar16._14_2_;
      uStack_396 = (ushort)bStack_64f;
      uStack_394 = (ushort)bStack_64e;
      uStack_392 = (ushort)bStack_64d;
      uStack_38e = (ushort)bStack_64b;
      uStack_38c = (ushort)bStack_64a;
      uStack_38a = (ushort)bStack_649;
      local_3b8 = auVar14._0_2_;
      sStack_3b6 = auVar14._2_2_;
      sStack_3b4 = auVar14._4_2_;
      sStack_3b2 = auVar14._6_2_;
      sStack_3b0 = auVar14._8_2_;
      sStack_3ae = auVar14._10_2_;
      sStack_3ac = auVar14._12_2_;
      sStack_3aa = auVar14._14_2_;
      uVar10 = local_3b8 + (ushort)local_5d8 * local_388 + 0x80;
      uVar17 = sStack_3b6 + uStack_376 * sStack_386 + 0x80;
      uVar21 = sStack_3b4 + uStack_374 * sStack_384 + 0x80;
      uVar25 = sStack_3b2 + uStack_372 * sStack_382 + 0x80;
      uVar29 = sStack_3b0 + (ushort)bStack_5d4 * sStack_380 + 0x80;
      uVar33 = sStack_3ae + uStack_36e * sStack_37e + 0x80;
      uVar37 = sStack_3ac + uStack_36c * sStack_37c + 0x80;
      uVar41 = sStack_3aa + uStack_36a * sStack_37a + 0x80;
      uVar11 = uVar10 >> 8;
      uVar18 = uVar17 >> 8;
      uVar22 = uVar21 >> 8;
      uVar26 = uVar25 >> 8;
      uVar30 = uVar29 >> 8;
      uVar34 = uVar33 >> 8;
      uVar38 = uVar37 >> 8;
      uVar42 = uVar41 >> 8;
      uVar12 = local_3b8 + (ushort)bStack_650 * local_388 + 0x80;
      uVar19 = sStack_3b6 + uStack_396 * sStack_386 + 0x80;
      uVar23 = sStack_3b4 + uStack_394 * sStack_384 + 0x80;
      uVar27 = sStack_3b2 + uStack_392 * sStack_382 + 0x80;
      uVar31 = sStack_3b0 + (ushort)bStack_64c * sStack_380 + 0x80;
      uVar35 = sStack_3ae + uStack_38e * sStack_37e + 0x80;
      uVar39 = sStack_3ac + uStack_38c * sStack_37c + 0x80;
      uVar43 = sStack_3aa + uStack_38a * sStack_37a + 0x80;
      uVar13 = uVar12 >> 8;
      uVar20 = uVar19 >> 8;
      uVar24 = uVar23 >> 8;
      uVar28 = uVar27 >> 8;
      uVar32 = uVar31 >> 8;
      uVar36 = uVar35 >> 8;
      uVar40 = uVar39 >> 8;
      uVar44 = uVar43 >> 8;
      *local_730 = CONCAT17((uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8) - (0xff < uVar42)
                            ,CONCAT16((uVar38 != 0) * (uVar38 < 0x100) * (char)(uVar37 >> 8) -
                                      (0xff < uVar38),
                                      CONCAT15((uVar34 != 0) * (uVar34 < 0x100) *
                                               (char)(uVar33 >> 8) - (0xff < uVar34),
                                               CONCAT14((uVar30 != 0) * (uVar30 < 0x100) *
                                                        (char)(uVar29 >> 8) - (0xff < uVar30),
                                                        CONCAT13((uVar26 != 0) * (uVar26 < 0x100) *
                                                                 (char)(uVar25 >> 8) -
                                                                 (0xff < uVar26),
                                                                 CONCAT12((uVar22 != 0) *
                                                                          (uVar22 < 0x100) *
                                                                          (char)(uVar21 >> 8) -
                                                                          (0xff < uVar22),
                                                                          CONCAT11((uVar18 != 0) *
                                                                                   (uVar18 < 0x100)
                                                                                   * (char)(uVar17 
                                                  >> 8) - (0xff < uVar18),
                                                  (uVar11 != 0) * (uVar11 < 0x100) *
                                                  (char)(uVar10 >> 8) - (0xff < uVar11))))))));
      local_730[1] = CONCAT17((uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8) -
                              (0xff < uVar44),
                              CONCAT16((uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8) -
                                       (0xff < uVar40),
                                       CONCAT15((uVar36 != 0) * (uVar36 < 0x100) *
                                                (char)(uVar35 >> 8) - (0xff < uVar36),
                                                CONCAT14((uVar32 != 0) * (uVar32 < 0x100) *
                                                         (char)(uVar31 >> 8) - (0xff < uVar32),
                                                         CONCAT13((uVar28 != 0) * (uVar28 < 0x100) *
                                                                  (char)(uVar27 >> 8) -
                                                                  (0xff < uVar28),
                                                                  CONCAT12((uVar24 != 0) *
                                                                           (uVar24 < 0x100) *
                                                                           (char)(uVar23 >> 8) -
                                                                           (0xff < uVar24),
                                                                           CONCAT11((uVar20 != 0) *
                                                                                    (uVar20 < 0x100)
                                                                                    * (char)(uVar19 
                                                  >> 8) - (0xff < uVar20),
                                                  (uVar13 != 0) * (uVar13 < 0x100) *
                                                  (char)(uVar12 >> 8) - (0xff < uVar13))))))));
      local_730 = (undefined8 *)(in_RSI + (long)local_730);
    }
  }
  return;
}

Assistant:

void aom_smooth_v_predictor_16x64_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i bottom_left = _mm_set1_epi16(left_column[63]);
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i round = _mm_set1_epi16(128);
  const __m128i zero = _mm_setzero_si128();
  const __m128i top = LoadUnaligned16(top_row);
  const __m128i top_lo = cvtepu8_epi16(top);
  const __m128i top_hi = _mm_unpackhi_epi8(top, zero);
  const uint8_t *weights_base_ptr = smooth_weights + 60;
  for (int left_offset = 0; left_offset < 64; left_offset += 16) {
    const __m128i weights = LoadUnaligned16(weights_base_ptr + left_offset);
    const __m128i weights_lo = cvtepu8_epi16(weights);
    const __m128i weights_hi = _mm_unpackhi_epi8(weights, zero);
    const __m128i inverted_weights_lo = _mm_sub_epi16(scale, weights_lo);
    const __m128i inverted_weights_hi = _mm_sub_epi16(scale, weights_hi);
    const __m128i scaled_bottom_left_lo =
        _mm_mullo_epi16(inverted_weights_lo, bottom_left);
    const __m128i scaled_bottom_left_hi =
        _mm_mullo_epi16(inverted_weights_hi, bottom_left);

    for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
      const __m128i y_select = _mm_set1_epi32(y_mask);
      const __m128i weights_y = _mm_shuffle_epi8(weights_lo, y_select);
      const __m128i scaled_bottom_left_y =
          _mm_shuffle_epi8(scaled_bottom_left_lo, y_select);
      write_smooth_directional_sum16(dst, top_lo, top_hi, weights_y, weights_y,
                                     scaled_bottom_left_y, scaled_bottom_left_y,
                                     round);
      dst += stride;
    }
    for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
      const __m128i y_select = _mm_set1_epi32(y_mask);
      const __m128i weights_y = _mm_shuffle_epi8(weights_hi, y_select);
      const __m128i scaled_bottom_left_y =
          _mm_shuffle_epi8(scaled_bottom_left_hi, y_select);
      write_smooth_directional_sum16(dst, top_lo, top_hi, weights_y, weights_y,
                                     scaled_bottom_left_y, scaled_bottom_left_y,
                                     round);
      dst += stride;
    }
  }
}